

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void * ZSTD_cwksp_reserve_table(ZSTD_cwksp *ws,size_t bytes)

{
  void *pvVar1;
  uint uVar2;
  size_t code;
  void *pvVar3;
  void *top;
  void *end;
  void *alloc;
  ZSTD_cwksp_alloc_phase_e phase;
  size_t bytes_local;
  ZSTD_cwksp *ws_local;
  
  code = ZSTD_cwksp_internal_advance_phase(ws,ZSTD_cwksp_alloc_aligned);
  uVar2 = ERR_isError(code);
  if (uVar2 == 0) {
    ws_local = (ZSTD_cwksp *)ws->tableEnd;
    pvVar3 = (void *)((long)&ws_local->workspace + bytes);
    pvVar1 = ws->allocStart;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pvVar1 < pvVar3) {
      ws->allocFailed = '\x01';
      ws_local = (ZSTD_cwksp *)0x0;
    }
    else {
      ws->tableEnd = pvVar3;
    }
  }
  else {
    ws_local = (ZSTD_cwksp *)0x0;
  }
  return ws_local;
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_table(ZSTD_cwksp* ws, size_t bytes) {
    const ZSTD_cwksp_alloc_phase_e phase = ZSTD_cwksp_alloc_aligned;
    void* alloc;
    void* end;
    void* top;

    if (ZSTD_isError(ZSTD_cwksp_internal_advance_phase(ws, phase))) {
        return NULL;
    }
    alloc = ws->tableEnd;
    end = (BYTE *)alloc + bytes;
    top = ws->allocStart;

    DEBUGLOG(5, "cwksp: reserving %p table %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    assert((bytes & (sizeof(U32)-1)) == 0);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(end <= top);
    if (end > top) {
        DEBUGLOG(4, "cwksp: table alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    ws->tableEnd = end;

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    if (ws->isStatic == ZSTD_cwksp_dynamic_alloc) {
        __asan_unpoison_memory_region(alloc, bytes);
    }
#endif

    assert((bytes & (ZSTD_CWKSP_ALIGNMENT_BYTES-1)) == 0);
    assert(((size_t)alloc & (ZSTD_CWKSP_ALIGNMENT_BYTES-1))== 0);
    return alloc;
}